

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O1

uint32_t * unpack6_16(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint uVar1;
  
  *out = (*in & 0x3f) + base;
  out[1] = (*in >> 6 & 0x3f) + base;
  out[2] = (*in >> 0xc & 0x3f) + base;
  out[3] = (*in >> 0x12 & 0x3f) + base;
  out[4] = (*(byte *)((long)in + 3) & 0x3f) + base;
  uVar1 = *in;
  out[5] = uVar1 >> 0x1e;
  out[5] = (uVar1 >> 0x1e) + base + (in[1] & 0xf) * 4;
  out[6] = (in[1] >> 4 & 0x3f) + base;
  out[7] = (in[1] >> 10 & 0x3f) + base;
  out[8] = (*(ushort *)((long)in + 6) & 0x3f) + base;
  out[9] = (in[1] >> 0x16 & 0x3f) + base;
  uVar1 = in[1];
  out[10] = uVar1 >> 0x1c;
  out[10] = (uVar1 >> 0x1c) + base + (in[2] & 3) * 0x10;
  out[0xb] = (in[2] >> 2 & 0x3f) + base;
  out[0xc] = (in[2] >> 8 & 0x3f) + base;
  out[0xd] = (in[2] >> 0xe & 0x3f) + base;
  out[0xe] = (in[2] >> 0x14 & 0x3f) + base;
  out[0xf] = (in[2] >> 0x1a) + base;
  return in + 3;
}

Assistant:

uint32_t * unpack6_16( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out = ( (*in) >>  0  )   % (1U << 6 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  6  )   % (1U << 6 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  12  )   % (1U << 6 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  18  )   % (1U << 6 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  24  )   % (1U << 6 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  30  ) ;
    ++in;
    *out |= ((*in) % (1U<< 4 ))<<( 6 - 4 );
    *out += base;
    out++;
    *out = ( (*in) >>  4  )   % (1U << 6 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  10  )   % (1U << 6 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  16  )   % (1U << 6 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  22  )   % (1U << 6 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  28  ) ;
    ++in;
    *out |= ((*in) % (1U<< 2 ))<<( 6 - 2 );
    *out += base;
    out++;
    *out = ( (*in) >>  2  )   % (1U << 6 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  8  )   % (1U << 6 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  14  )   % (1U << 6 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  20  )   % (1U << 6 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  26  ) ;
    ++in;
    *out += base;
    out++;

    return in;
}